

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O3

class_book * object_kind_to_book(object_kind *kind)

{
  class_book *pcVar1;
  player_class *ppVar2;
  long lVar3;
  
  ppVar2 = classes;
  do {
    if (ppVar2 == (player_class *)0x0) {
      return (class_book *)0x0;
    }
    lVar3 = (long)(ppVar2->magic).num_books;
    if (0 < lVar3) {
      pcVar1 = (ppVar2->magic).books;
      do {
        if ((kind->tval == pcVar1->tval) && (kind->sval == pcVar1->sval)) {
          return pcVar1;
        }
        pcVar1 = pcVar1 + 1;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    ppVar2 = ppVar2->next;
  } while( true );
}

Assistant:

const struct class_book *object_kind_to_book(const struct object_kind *kind)
{
	struct player_class *class = classes;
	while (class) {
		int i;

		for (i = 0; i < class->magic.num_books; i++)
		if ((kind->tval == class->magic.books[i].tval) &&
			(kind->sval == class->magic.books[i].sval)) {
			return &class->magic.books[i];
		}
		class = class->next;
	}

	return NULL;
}